

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false>_>_>
::_initialize_U(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false>_>_>
                *this)

{
  ulong uVar1;
  pair<unsigned_int,_unsigned_int> local_48;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_40;
  
  for (uVar1 = 0; uVar1 < (this->reducedMatrixR_).nextInsertIndex_; uVar1 = uVar1 + 1) {
    local_48 = (pair<unsigned_int,_unsigned_int>)(uVar1 + 0x100000000);
    local_40._M_len = 1;
    local_40._M_array = &local_48;
    Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,false>>>
    ::insert_column<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
              ((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,false>>>
                *)&this->mirrorMatrixU_,&local_40);
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_initialize_U()
{
  typename std::conditional<Master_matrix::Option_list::is_z2, Index, std::pair<Index, Field_element> >::type id;
  if constexpr (!Master_matrix::Option_list::is_z2) id.second = 1;

  for (ID_index i = 0; i < reducedMatrixR_.get_number_of_columns(); i++) {
    if constexpr (Master_matrix::Option_list::is_z2)
      id = i;
    else
      id.first = i;
    mirrorMatrixU_.insert_column({id});
  }
}